

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::UnRegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          DWORD dwPid)

{
  int iVar1;
  MonitoredProcessesListNode *local_38;
  MonitoredProcessesListNode *pmplnPrev;
  MonitoredProcessesListNode *pmpln;
  PAL_ERROR palErr;
  DWORD dwPid_local;
  CSynchData *psdSynchData_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pmpln._0_4_ = 0;
  local_38 = (MonitoredProcessesListNode *)0x0;
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  pmplnPrev = this->m_pmplnMonitoredProcesses;
  do {
    if (pmplnPrev == (MonitoredProcessesListNode *)0x0) {
LAB_003c343a:
      if (pmplnPrev == (MonitoredProcessesListNode *)0x0) {
        pmpln._0_4_ = 0x490;
      }
      else {
        iVar1 = pmplnPrev->lRefCount + -1;
        pmplnPrev->lRefCount = iVar1;
        if (iVar1 == 0) {
          if (local_38 == (MonitoredProcessesListNode *)0x0) {
            this->m_pmplnMonitoredProcesses = pmplnPrev->pNext;
          }
          else {
            local_38->pNext = pmplnPrev->pNext;
          }
          this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + -1;
          CSynchData::Release(pmplnPrev->psdSynchData,pthrCurrent);
          InternalDelete<CorUnix::CPalSynchronizationManager::_MonitoredProcessesListNode>
                    (pmplnPrev);
        }
      }
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      return (PAL_ERROR)pmpln;
    }
    if (psdSynchData == pmplnPrev->psdSynchData) {
      if (dwPid != pmplnPrev->dwPid) {
        fprintf(_stderr,"] %s %s:%d","UnRegisterProcessForMonitoring",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xbce);
        fprintf(_stderr,
                "Expression: dwPid == pmpln->dwPid, Description: Invalid node in Monitored Processes List\n"
               );
      }
      goto LAB_003c343a;
    }
    local_38 = pmplnPrev;
    pmplnPrev = pmplnPrev->pNext;
  } while( true );
}

Assistant:

PAL_ERROR CPalSynchronizationManager::UnRegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        DWORD dwPid)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln, * pmplnPrev = NULL;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(dwPid == pmpln->dwPid,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmplnPrev = pmpln;
            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            if (0 == --pmpln->lRefCount)
            {
                if (NULL != pmplnPrev)
                {
                    pmplnPrev->pNext = pmpln->pNext;
                }
                else
                {
                    m_pmplnMonitoredProcesses = pmpln->pNext;
                }

                m_lMonitoredProcessesCount--;
                pmpln->psdSynchData->Release(pthrCurrent);
                InternalDelete(pmpln);
            }
        }
        else
        {
            palErr = ERROR_NOT_FOUND;
        }

        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        return palErr;
    }